

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3.h
# Opt level: O0

void ncnn::convdw3x3s1_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  Mat *in_RCX;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  float sum_1;
  int remain_1;
  float sum2;
  float sum;
  int remain;
  int i;
  float *k2;
  float *k1;
  float *k0;
  float *r3;
  float *r2;
  float *r1;
  float *r0;
  float *img0;
  float *outptr2;
  float *outptr;
  float *kernel0;
  float bias0;
  Mat out;
  int g;
  float *bias;
  float *kernel;
  int group;
  int outh;
  int outw;
  int w;
  float in_stack_fffffffffffffea4;
  float in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  int iVar22;
  int local_148;
  int local_144;
  float *local_128;
  float *local_120;
  float *local_118;
  float *local_110;
  Mat local_f8;
  float *local_b8;
  float *local_b0;
  float *local_a8;
  float *local_a0;
  float local_94;
  Mat local_90;
  int local_4c;
  float *local_48;
  float *local_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  Mat *local_20;
  
  local_2c = *(int *)(in_RDI + 0x2c);
  local_30 = *(int *)(in_RSI + 0x2c);
  local_34 = *(int *)(in_RSI + 0x30);
  local_38 = *(int *)(in_RDI + 0x34);
  local_20 = in_RCX;
  local_40 = Mat::operator_cast_to_float_(in_RDX);
  local_48 = Mat::operator_cast_to_float_(local_20);
  for (local_4c = 0; local_4c < local_38; local_4c = local_4c + 1) {
    Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                 (int)in_stack_fffffffffffffea4);
    if (local_48 == (float *)0x0) {
      in_stack_fffffffffffffea4 = 0.0;
    }
    else {
      in_stack_fffffffffffffea4 = local_48[local_4c];
    }
    local_a0 = local_40 + local_4c * 9;
    local_94 = in_stack_fffffffffffffea4;
    local_a8 = Mat::operator_cast_to_float_(&local_90);
    local_b0 = local_a8 + local_30;
    Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                 (int)in_stack_fffffffffffffea4);
    pfVar19 = Mat::operator_cast_to_float_(&local_f8);
    Mat::~Mat((Mat *)0x18d215);
    local_118 = pfVar19 + local_2c;
    local_120 = pfVar19 + (local_2c << 1);
    local_128 = pfVar19 + local_2c * 3;
    pfVar20 = local_a0 + 3;
    pfVar21 = local_a0 + 6;
    local_110 = pfVar19;
    for (local_144 = 0; local_144 + 1 < local_34; local_144 = local_144 + 2) {
      for (local_148 = local_30; 0 < local_148; local_148 = local_148 + -1) {
        fVar1 = *local_118;
        fVar2 = *local_a0;
        fVar3 = local_118[1];
        fVar4 = local_a0[1];
        fVar5 = local_118[2];
        fVar6 = local_a0[2];
        fVar7 = *local_120;
        fVar8 = *pfVar20;
        fVar9 = local_120[1];
        fVar10 = local_a0[4];
        fVar11 = local_120[2];
        fVar12 = local_a0[5];
        fVar13 = *local_128;
        fVar14 = *pfVar21;
        fVar15 = local_128[1];
        fVar16 = local_a0[7];
        fVar17 = local_128[2];
        fVar18 = local_a0[8];
        *local_a8 = local_120[2] * local_a0[8] +
                    local_120[1] * local_a0[7] +
                    *local_120 * *pfVar21 +
                    local_118[2] * local_a0[5] +
                    local_118[1] * local_a0[4] +
                    *local_118 * *pfVar20 +
                    local_110[2] * local_a0[2] +
                    local_110[1] * local_a0[1] + *local_110 * *local_a0 + local_94;
        *local_b0 = fVar17 * fVar18 +
                    fVar15 * fVar16 +
                    fVar13 * fVar14 +
                    fVar11 * fVar12 +
                    fVar9 * fVar10 +
                    fVar7 * fVar8 + fVar5 * fVar6 + fVar3 * fVar4 + fVar1 * fVar2 + local_94;
        local_110 = local_110 + 1;
        local_118 = local_118 + 1;
        local_120 = local_120 + 1;
        local_128 = local_128 + 1;
        local_a8 = local_a8 + 1;
        local_b0 = local_b0 + 1;
      }
      local_110 = local_110 + (local_2c + 2);
      local_118 = local_118 + (local_2c + 2);
      local_120 = local_120 + (local_2c + 2);
      local_128 = local_128 + (local_2c + 2);
      local_a8 = local_a8 + local_30;
      local_b0 = local_b0 + local_30;
    }
    for (; iVar22 = local_30, local_144 < local_34; local_144 = local_144 + 1) {
      for (; 0 < iVar22; iVar22 = iVar22 + -1) {
        in_stack_fffffffffffffea8 =
             local_120[2] * local_a0[8] +
             local_120[1] * local_a0[7] +
             *local_120 * *pfVar21 +
             local_118[2] * local_a0[5] +
             local_118[1] * local_a0[4] +
             *local_118 * *pfVar20 +
             local_110[2] * local_a0[2] +
             local_110[1] * local_a0[1] + *local_110 * *local_a0 + local_94;
        *local_a8 = in_stack_fffffffffffffea8;
        local_110 = local_110 + 1;
        local_118 = local_118 + 1;
        local_120 = local_120 + 1;
        local_a8 = local_a8 + 1;
      }
      local_110 = local_110 + 2;
      local_118 = local_118 + 2;
      local_120 = local_120 + 2;
      in_stack_fffffffffffffeac = iVar22;
    }
    local_b8 = pfVar19;
    Mat::~Mat((Mat *)0x18d8b3);
  }
  return;
}

Assistant:

static void convdw3x3s1_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const float* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g=0; g<group; g++)
    {
        Mat out = top_blob.channel(g);

        const float bias0 = bias ? bias[g] : 0.f;

        const float* kernel0 = kernel + g*9;

        float* outptr = out;
        float* outptr2 = outptr + outw;

        const float* img0 = bottom_blob.channel(g);

        const float* r0 = img0;
        const float* r1 = img0 + w;
        const float* r2 = img0 + w*2;
        const float* r3 = img0 + w*3;

        const float* k0 = kernel0;
        const float* k1 = kernel0 + 3;
        const float* k2 = kernel0 + 6;

        int i = 0;

        for (; i+1 < outh; i+=2)
        {

            int remain = outw;

            for (; remain>0; remain--)
            {
                float sum = bias0;
                sum += r0[0] * k0[0];
                sum += r0[1] * k0[1];
                sum += r0[2] * k0[2];
                sum += r1[0] * k1[0];
                sum += r1[1] * k1[1];
                sum += r1[2] * k1[2];
                sum += r2[0] * k2[0];
                sum += r2[1] * k2[1];
                sum += r2[2] * k2[2];

                float sum2 = bias0;
                sum2 += r1[0] * k0[0];
                sum2 += r1[1] * k0[1];
                sum2 += r1[2] * k0[2];
                sum2 += r2[0] * k1[0];
                sum2 += r2[1] * k1[1];
                sum2 += r2[2] * k1[2];
                sum2 += r3[0] * k2[0];
                sum2 += r3[1] * k2[1];
                sum2 += r3[2] * k2[2];

                *outptr = sum;
                *outptr2 = sum2;

                r0++;
                r1++;
                r2++;
                r3++;
                outptr++;
                outptr2++;
            }

            r0 += 2 + w;
            r1 += 2 + w;
            r2 += 2 + w;
            r3 += 2 + w;

            outptr += outw;
            outptr2 += outw;
        }

        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain>0; remain--)
            {
                float sum = bias0;
                sum += r0[0] * k0[0];
                sum += r0[1] * k0[1];
                sum += r0[2] * k0[2];
                sum += r1[0] * k1[0];
                sum += r1[1] * k1[1];
                sum += r1[2] * k1[2];
                sum += r2[0] * k2[0];
                sum += r2[1] * k2[1];
                sum += r2[2] * k2[2];

                *outptr = sum;

                r0++;
                r1++;
                r2++;
                outptr++;
            }

            r0 += 2;
            r1 += 2;
            r2 += 2;
        }
    }
}